

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode
resobj_Alloc(CUPDLPresobj *resobj,CUPDLPproblem *problem,cupdlp_int ncols,cupdlp_int nrows)

{
  void *pvVar1;
  int in_ECX;
  int in_EDX;
  cupdlp_float *in_RSI;
  undefined8 *in_RDI;
  cupdlp_retcode retcode;
  cupdlp_int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  cupdlp_retcode cVar2;
  
  cVar2 = 0;
  pvVar1 = calloc((long)in_ECX,8);
  in_RDI[8] = pvVar1;
  if (in_RDI[8] == 0) {
    cVar2 = 1;
  }
  else {
    pvVar1 = calloc((long)in_EDX,8);
    in_RDI[9] = pvVar1;
    if (in_RDI[9] == 0) {
      cVar2 = 1;
    }
    else {
      pvVar1 = calloc((long)in_ECX,8);
      in_RDI[0x28] = pvVar1;
      if (in_RDI[0x28] == 0) {
        cVar2 = 1;
      }
      else {
        pvVar1 = calloc((long)in_EDX,8);
        in_RDI[0x29] = pvVar1;
        if (in_RDI[0x29] == 0) {
          cVar2 = 1;
        }
        else {
          pvVar1 = calloc((long)in_EDX,8);
          in_RDI[10] = pvVar1;
          if (in_RDI[10] == 0) {
            cVar2 = 1;
          }
          else {
            pvVar1 = calloc((long)in_EDX,8);
            in_RDI[0xb] = pvVar1;
            if (in_RDI[0xb] == 0) {
              cVar2 = 1;
            }
            else {
              pvVar1 = calloc((long)in_EDX,8);
              in_RDI[0xc] = pvVar1;
              if (in_RDI[0xc] == 0) {
                cVar2 = 1;
              }
              else {
                pvVar1 = calloc((long)in_EDX,8);
                in_RDI[0xd] = pvVar1;
                if (in_RDI[0xd] == 0) {
                  cVar2 = 1;
                }
                else {
                  pvVar1 = calloc((long)in_EDX,8);
                  in_RDI[0xe] = pvVar1;
                  if (in_RDI[0xe] == 0) {
                    cVar2 = 1;
                  }
                  else {
                    pvVar1 = calloc((long)in_EDX,8);
                    in_RDI[0xf] = pvVar1;
                    if (in_RDI[0xf] == 0) {
                      cVar2 = 1;
                    }
                    else {
                      pvVar1 = calloc((long)in_EDX,8);
                      in_RDI[0x1a] = pvVar1;
                      if (in_RDI[0x1a] == 0) {
                        cVar2 = 1;
                      }
                      else {
                        pvVar1 = calloc((long)in_ECX,8);
                        in_RDI[0x1b] = pvVar1;
                        if (in_RDI[0x1b] == 0) {
                          cVar2 = 1;
                        }
                        else {
                          pvVar1 = calloc((long)in_EDX,8);
                          in_RDI[0x1c] = pvVar1;
                          if (in_RDI[0x1c] == 0) {
                            cVar2 = 1;
                          }
                          else {
                            pvVar1 = calloc((long)in_ECX,8);
                            in_RDI[0x1d] = pvVar1;
                            if (in_RDI[0x1d] == 0) {
                              cVar2 = 1;
                            }
                            else {
                              pvVar1 = calloc((long)in_EDX,8);
                              in_RDI[0x1e] = pvVar1;
                              if (in_RDI[0x1e] == 0) {
                                cVar2 = 1;
                              }
                              else {
                                pvVar1 = calloc((long)in_EDX,8);
                                in_RDI[0x1f] = pvVar1;
                                if (in_RDI[0x1f] == 0) {
                                  cVar2 = 1;
                                }
                                else {
                                  pvVar1 = calloc((long)in_EDX,8);
                                  in_RDI[0x20] = pvVar1;
                                  if (in_RDI[0x20] == 0) {
                                    cVar2 = 1;
                                  }
                                  else {
                                    cupdlp_filterlb(in_RSI,(cupdlp_float *)CONCAT44(in_EDX,in_ECX),
                                                    (cupdlp_float)
                                                    CONCAT44(cVar2,in_stack_ffffffffffffffe0),
                                                    in_stack_ffffffffffffffdc);
                                    cupdlp_filterub(in_RSI,(cupdlp_float *)CONCAT44(in_EDX,in_ECX),
                                                    (cupdlp_float)
                                                    CONCAT44(cVar2,in_stack_ffffffffffffffe0),
                                                    in_stack_ffffffffffffffdc);
                                    *in_RDI = 0x3e45798ee2308c3a;
                                    in_RDI[1] = 0;
                                    in_RDI[2] = 0;
                                    in_RDI[3] = 0;
                                    in_RDI[4] = 0;
                                    in_RDI[5] = 0;
                                    in_RDI[6] = 0;
                                    in_RDI[7] = 0;
                                    in_RDI[0x21] = 0;
                                    in_RDI[0x22] = 0;
                                    in_RDI[0x23] = 0;
                                    in_RDI[0x24] = 0;
                                    in_RDI[0x25] = 0;
                                    in_RDI[0x26] = 0;
                                    in_RDI[0x27] = 0;
                                    in_RDI[0x2a] = 0;
                                    in_RDI[0x2b] = 0;
                                    in_RDI[0x2c] = 0;
                                    in_RDI[0x2d] = 0;
                                    in_RDI[0x2e] = 0;
                                    in_RDI[0x2f] = 0;
                                    *(undefined4 *)(in_RDI + 0x10) = 5;
                                    *(undefined4 *)((long)in_RDI + 0x84) = 5;
                                    *(undefined4 *)(in_RDI + 0x11) = 0;
                                    in_RDI[0x12] = 0;
                                    in_RDI[0x13] = 0;
                                    in_RDI[0x14] = 0x3ff0000000000000;
                                    in_RDI[0x15] = 0x3ff0000000000000;
                                    in_RDI[0x16] = 0;
                                    in_RDI[0x17] = 0;
                                    in_RDI[0x18] = 0x3ff0000000000000;
                                    in_RDI[0x19] = 0x3ff0000000000000;
                                    *(undefined4 *)(in_RDI + 0x30) = 4;
                                    *(undefined4 *)((long)in_RDI + 0x184) = 0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return cVar2;
}

Assistant:

cupdlp_retcode resobj_Alloc(CUPDLPresobj *resobj, CUPDLPproblem *problem,
                            cupdlp_int ncols, cupdlp_int nrows) {
  cupdlp_retcode retcode = RETCODE_OK;

#if !defined(CUPDLP_CPU) && USE_KERNELS
  resobj->primalResidual = NULL;
  resobj->dualResidual = NULL;
  resobj->primalResidualAverage = NULL;
  resobj->dualResidualAverage = NULL;
#else

  cupdlp_init_zero_vec_double(resobj->primalResidual, nrows);
  cupdlp_init_zero_vec_double(resobj->dualResidual, ncols);
  cupdlp_init_zero_vec_double(resobj->primalResidualAverage, nrows);
  cupdlp_init_zero_vec_double(resobj->dualResidualAverage, ncols);

#endif

  cupdlp_init_zero_vec_double(resobj->dSlackPos, ncols);
  cupdlp_init_zero_vec_double(resobj->dSlackNeg, ncols);
  cupdlp_init_zero_vec_double(resobj->dSlackPosAverage, ncols);
  cupdlp_init_zero_vec_double(resobj->dSlackNegAverage, ncols);
  cupdlp_init_zero_vec_double(resobj->dLowerFiltered, ncols);
  cupdlp_init_zero_vec_double(resobj->dUpperFiltered, ncols);

#if !defined(CUPDLP_CPU) && USE_KERNELS
  resobj->primalInfeasRay = NULL;
  resobj->primalInfeasConstr = NULL;
  resobj->primalInfeasBound = NULL;
  resobj->dualInfeasRay = NULL;
  resobj->dualInfeasLbRay = NULL;
  resobj->dualInfeasUbRay = NULL;
#else

  cupdlp_init_zero_vec_double(resobj->primalInfeasRay, ncols);
  cupdlp_init_zero_vec_double(resobj->primalInfeasConstr, nrows);
  cupdlp_init_zero_vec_double(resobj->primalInfeasBound, ncols);
  cupdlp_init_zero_vec_double(resobj->dualInfeasRay, nrows);
  cupdlp_init_zero_vec_double(resobj->dualInfeasLbRay, ncols);
  cupdlp_init_zero_vec_double(resobj->dualInfeasUbRay, ncols);
#endif


#if !defined(CUPDLP_CPU) && USE_KERNELS
  resobj->dualInfeasConstr = NULL;
#else
  cupdlp_init_zero_vec_double(resobj->dualInfeasConstr, ncols);
#endif

  // CUPDLP_INIT_DOUBLE_ZERO_VEC(resobj->dualInfeasBound, nrows);

  cupdlp_filterlb(resobj->dLowerFiltered, problem->lower, -INFINITY, ncols);
  cupdlp_filterub(resobj->dUpperFiltered, problem->upper, +INFINITY, ncols);

  // initialization
  resobj->dFeasTol = 1e-8;
  resobj->dPrimalObj = 0.0;
  resobj->dDualObj = 0.0;
  resobj->dDualityGap = 0.0;
  resobj->dComplementarity = 0.0;
  resobj->dPrimalFeas = 0.0;
  resobj->dDualFeas = 0.0;
  resobj->dRelObjGap = 0.0;
  resobj->dPrimalObjAverage = 0.0;
  resobj->dDualObjAverage = 0.0;
  resobj->dDualityGapAverage = 0.0;
  resobj->dComplementarityAverage = 0.0;
  resobj->dPrimalFeasAverage = 0.0;
  resobj->dDualFeasAverage = 0.0;
  resobj->dRelObjGapAverage = 0.0;
  resobj->dPrimalFeasLastRestart = 0.0;
  resobj->dDualFeasLastRestart = 0.0;
  resobj->dDualityGapLastRestart = 0.0;
  resobj->dPrimalFeasLastCandidate = 0.0;
  resobj->dDualFeasLastCandidate = 0.0;
  resobj->dDualityGapLastCandidate = 0.0;

  resobj->primalCode = FEASIBLE;
  resobj->dualCode = FEASIBLE;
  resobj->termInfeasIterate = LAST_ITERATE;
  resobj->dPrimalInfeasObj = 0.0;
  resobj->dDualInfeasObj = 0.0;
  resobj->dPrimalInfeasRes = 1.0;
  resobj->dDualInfeasRes = 1.0;
  resobj->dPrimalInfeasObjAverage = 0.0;
  resobj->dDualInfeasObjAverage = 0.0;
  resobj->dPrimalInfeasResAverage = 1.0;
  resobj->dDualInfeasResAverage = 1.0;

  resobj->termCode = TIMELIMIT_OR_ITERLIMIT;
  resobj->termIterate = LAST_ITERATE;

  // todo, pass work
  //   cupdlp_twoNorm(problem->cost, ncols, &resobj->dNormCost);
  //   twoNorm(problem->rhs, nrows);

exit_cleanup:
  return retcode;
}